

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberZ.cpp
# Opt level: O0

void __thiscall OpenMD::NumberZ::writeNumberZ(NumberZ *this)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  byte bVar6;
  size_type sVar7;
  reference pdVar8;
  char *pcVar9;
  ostream *poVar10;
  reference pvVar11;
  undefined8 uVar12;
  long in_RDI;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  RealType volSlice;
  RealType z;
  uint i;
  RealType binNumber;
  ofstream rdfStream;
  RealType areaAve;
  RealType areaSum;
  RealType zAve;
  RealType zSum;
  iterator j;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd08;
  errorStruct *peVar17;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffd10;
  uint local_26c;
  ostream local_250 [512];
  double local_50;
  double *local_48;
  double *local_40;
  double local_38;
  double local_30;
  double *local_28;
  double *local_20;
  double local_18;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_10 [2];
  
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
  __normal_iterator(local_10);
  local_18 = 0.0;
  local_20 = (double *)
             std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffd08);
  local_10[0]._M_current = local_20;
  while( true ) {
    local_28 = (double *)
               std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffd08);
    bVar5 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffd10,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffd08);
    local_30 = local_18;
    if (!bVar5) break;
    pdVar8 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(local_10);
    local_18 = *pdVar8 + local_18;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(local_10);
  }
  sVar7 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x718));
  auVar15._8_4_ = (int)(sVar7 >> 0x20);
  auVar15._0_8_ = sVar7;
  auVar15._12_4_ = 0x45300000;
  local_30 = local_30 /
             ((auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0));
  local_38 = 0.0;
  local_40 = (double *)
             std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffd08);
  local_10[0]._M_current = local_40;
  while( true ) {
    local_48 = (double *)
               std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffd08);
    bVar5 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffd10,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffd08);
    local_50 = local_38;
    if (!bVar5) break;
    pdVar8 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(local_10);
    local_38 = *pdVar8 + local_38;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(local_10);
  }
  sVar7 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x730));
  auVar16._8_4_ = (int)(sVar7 >> 0x20);
  auVar16._0_8_ = sVar7;
  auVar16._12_4_ = 0x45300000;
  local_50 = local_50 /
             ((auVar16._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0));
  pcVar9 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_250,pcVar9,_S_out);
  bVar6 = std::ofstream::is_open();
  if ((bVar6 & 1) == 0) {
    uVar12 = std::__cxx11::string::c_str();
    peVar17 = &painCave;
    snprintf(painCave.errMsg,2000,"NumberZ: unable to open %s\n",uVar12);
    peVar17->isFatal = 1;
    simError();
  }
  else {
    poVar10 = std::operator<<(local_250,"#NumberZ ");
    std::operator<<(poVar10,"\n");
    poVar10 = std::operator<<(local_250,"#selection: (");
    poVar10 = std::operator<<(poVar10,(string *)(in_RDI + 0xd8));
    std::operator<<(poVar10,")\n");
    poVar10 = std::operator<<(local_250,"#");
    poVar10 = std::operator<<(poVar10,(string *)(in_RDI + 0x768));
    std::operator<<(poVar10,"\tnumber\n");
    for (local_26c = 0;
        sVar7 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x748)),
        local_26c < sVar7; local_26c = local_26c + 1) {
      dVar13 = local_30 * ((double)local_26c + 0.5);
      uVar2 = *(uint *)(in_RDI + 0x34);
      dVar14 = local_50 * local_30;
      uVar3 = *(uint *)(in_RDI + 0x34);
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x748),
                           (ulong)local_26c);
      dVar1 = *pvVar11;
      iVar4 = *(int *)(in_RDI + 0xd0);
      poVar10 = (ostream *)std::ostream::operator<<(local_250,dVar13 / (double)uVar2);
      poVar10 = std::operator<<(poVar10,"\t");
      poVar10 = (ostream *)
                std::ostream::operator<<(poVar10,dVar1 / ((dVar14 / (double)uVar3) * (double)iVar4))
      ;
      std::operator<<(poVar10,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_250);
  return;
}

Assistant:

void NumberZ::writeNumberZ() {
    // compute average box length:
    std::vector<RealType>::iterator j;
    RealType zSum = 0.0;
    for (j = zBox_.begin(); j != zBox_.end(); ++j) {
      zSum += *j;
    }
    RealType zAve = zSum / zBox_.size();

    RealType areaSum = 0.0;
    for (j = areas_.begin(); j != areas_.end(); ++j) {
      areaSum += *j;
    }
    RealType areaAve = areaSum / areas_.size();

    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#NumberZ "
                << "\n";
      rdfStream << "#selection: (" << selectionScript_ << ")\n";
      rdfStream << "#" << axisLabel_ << "\tnumber\n";
      RealType binNumber;
      for (unsigned int i = 0; i < numberZ_.size(); ++i) {
        RealType z = zAve * (i + 0.5) / nBins_;

        RealType volSlice = areaAve * zAve / nBins_;

        binNumber = numberZ_[i] / (volSlice * nProcessed_);

        rdfStream << z << "\t" << binNumber << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "NumberZ: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }